

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

TokenType __thiscall Json::Reader::readNumber(Reader *this)

{
  char *pcVar1;
  char *pcVar2;
  TokenType TVar3;
  
  pcVar1 = this->end_;
  pcVar2 = this->current_;
  TVar3 = tokenInteger;
  if (pcVar2 != pcVar1) {
    if (*pcVar2 == '-') {
      pcVar2 = pcVar2 + 1;
      this->current_ = pcVar2;
    }
    if (pcVar2 != pcVar1) {
      do {
        if (9 < (int)*pcVar2 - 0x30U) {
          pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (".eE+-","N6jbcoin9STPathSetE");
          if (pcVar1 == "N6jbcoin9STPathSetE") {
            return TVar3;
          }
          pcVar1 = this->end_;
          pcVar2 = this->current_;
          TVar3 = tokenDouble;
        }
        pcVar2 = pcVar2 + 1;
        this->current_ = pcVar2;
      } while (pcVar2 != pcVar1);
    }
  }
  return TVar3;
}

Assistant:

Reader::TokenType
Reader::readNumber ()
{
    static char const extended_tokens[] = { '.', 'e', 'E', '+', '-' };

    TokenType type = tokenInteger;

    if ( current_ != end_ )
    {
        if (*current_ == '-')
            ++current_;

        while ( current_ != end_ )
        {
            if (!std::isdigit (*current_))
            {
                auto ret = std::find (std::begin (extended_tokens),
                    std::end (extended_tokens), *current_);

                if (ret == std::end (extended_tokens))
                    break;

                type = tokenDouble;
            }

            ++current_;
        }
    }

    return type;
}